

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void flatbuffers::(anonymous_namespace)::
     SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
               (Offset<flatbuffers::Table> *begin,Offset<flatbuffers::Table> *end,size_t width,
               anon_class_8_1_ba1d59bf comparator,
               _func_void_Offset<flatbuffers::Table>_ptr_Offset<flatbuffers::Table>_ptr *swapper)

{
  voffset_t field;
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  uint *puVar4;
  Offset<flatbuffers::Table> *b;
  Offset<flatbuffers::Table> *a;
  
  do {
    if ((long)end - (long)begin < 5) {
      return;
    }
    a = begin + 1;
    b = end;
    while (a < b) {
      field = *(voffset_t *)(width + 0x108);
      uVar1 = a->o;
      puVar3 = (uint *)Table::GetAddressOf((Table *)((long)&begin->o + (ulong)begin->o),field);
      puVar4 = (uint *)Table::GetAddressOf((Table *)((long)&a->o + (ulong)uVar1),field);
      if ((puVar3 == (uint *)0x0) || (puVar4 == (uint *)0x0)) {
        if (puVar3 == (uint *)0x0) goto LAB_0011dff9;
LAB_0011dfe3:
        b = b + -1;
        anon_unknown_0::SwapSerializedTables(a,b);
      }
      else {
        bVar2 = String::operator<((String *)((ulong)*puVar3 + (long)puVar3),
                                  (String *)((ulong)*puVar4 + (long)puVar4));
        if (bVar2) goto LAB_0011dfe3;
LAB_0011dff9:
        a = a + 1;
      }
    }
    anon_unknown_0::SwapSerializedTables(begin,a + -1);
    SimpleQsort<flatbuffers::Offset<flatbuffers::Table>,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__3,void(*)(flatbuffers::Offset<flatbuffers::Table>*,flatbuffers::Offset<flatbuffers::Table>*)>
              (begin,a + -1,width,comparator,swapper);
    begin = b;
  } while( true );
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}